

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

void __thiscall cmFindBase::StoreFindResult(cmFindBase *this,string *value)

{
  string *psVar1;
  bool bVar2;
  PolicyStatus PVar3;
  PolicyStatus PVar4;
  int iVar5;
  pointer pcVar6;
  size_type sVar7;
  cmMakefile *pcVar8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view value_00;
  string_view value_01;
  string_view separator;
  string notFound;
  string local_118;
  string local_f8;
  string local_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_b8;
  size_type local_a0;
  char *local_98;
  undefined8 local_90;
  undefined8 local_88;
  char *local_80;
  undefined8 local_78;
  undefined8 local_70;
  char *local_68;
  undefined8 local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  size_type local_40;
  pointer local_38;
  string *local_30;
  
  PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0125,false);
  PVar4 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
  sVar7 = value->_M_string_length;
  if (sVar7 != 0) {
    pcVar8 = (this->super_cmFindCommon).Makefile;
    psVar1 = &this->VariableName;
    if (this->StoreResultInCache == true) {
      cmMakefile::AddCacheDefinition
                (pcVar8,psVar1,(cmValue)value,(cmValue)&this->VariableDocumentation,
                 this->VariableType,PVar3 == NEW);
      if (PVar4 != NEW) {
        return;
      }
      bVar2 = cmMakefile::IsNormalDefinitionSet((this->super_cmFindCommon).Makefile,psVar1);
      if (!bVar2) {
        return;
      }
      pcVar8 = (this->super_cmFindCommon).Makefile;
      pcVar6 = (value->_M_dataplus)._M_p;
      sVar7 = value->_M_string_length;
    }
    else {
      pcVar6 = (value->_M_dataplus)._M_p;
    }
    value_01._M_str = pcVar6;
    value_01._M_len = sVar7;
    cmMakefile::AddDefinition(pcVar8,psVar1,value_01);
    return;
  }
  psVar1 = &this->VariableName;
  local_b8.first._M_str = (this->VariableName)._M_dataplus._M_p;
  local_b8.first._M_len = (this->VariableName)._M_string_length;
  local_b8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a0 = 9;
  local_98 = "-NOTFOUND";
  local_90 = 0;
  views._M_len = 2;
  views._M_array = &local_b8;
  cmCatViews(&local_118,views);
  pcVar8 = (this->super_cmFindCommon).Makefile;
  if (this->StoreResultInCache == true) {
    cmMakefile::AddCacheDefinition
              (pcVar8,psVar1,&local_118,(cmValue)&this->VariableDocumentation,this->VariableType,
               PVar3 == NEW);
    if ((PVar4 != NEW) ||
       (bVar2 = cmMakefile::IsNormalDefinitionSet((this->super_cmFindCommon).Makefile,psVar1),
       !bVar2)) goto LAB_005b9132;
    pcVar8 = (this->super_cmFindCommon).Makefile;
  }
  value_00._M_str = local_118._M_dataplus._M_p;
  value_00._M_len = local_118._M_string_length;
  cmMakefile::AddDefinition(pcVar8,psVar1,value_00);
LAB_005b9132:
  if (this->Required == true) {
    pcVar8 = (this->super_cmFindCommon).Makefile;
    iVar5 = std::__cxx11::string::compare((char *)&this->FindCommandName);
    if (iVar5 == 0) {
      local_68 = "files";
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&this->FindCommandName);
      local_68 = "names";
      if (iVar5 == 0) {
        local_68 = "files";
      }
    }
    separator._M_str = ", ";
    separator._M_len = 2;
    cmJoin(&local_f8,&this->Names,separator,(string_view)ZEXT816(0));
    local_b8.first._M_len = 0xf;
    local_b8.first._M_str = "Could not find ";
    local_b8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_98 = (this->VariableName)._M_dataplus._M_p;
    local_a0 = (this->VariableName)._M_string_length;
    local_90 = 0;
    local_88 = 0x15;
    local_80 = " using the following ";
    local_78 = 0;
    local_70 = 5;
    local_60 = 0;
    local_58 = 2;
    local_50 = ": ";
    local_48 = 0;
    local_40 = local_f8._M_string_length;
    local_38 = local_f8._M_dataplus._M_p;
    views_00._M_len = 6;
    views_00._M_array = &local_b8;
    local_30 = &local_f8;
    cmCatViews(&local_d8,views_00);
    cmMakefile::IssueMessage(pcVar8,FATAL_ERROR,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::s_FatalErrorOccurred = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindBase::StoreFindResult(const std::string& value)
{
  bool force =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0125) == cmPolicies::NEW;
  bool updateNormalVariable =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) == cmPolicies::NEW;

  if (!value.empty()) {
    if (this->StoreResultInCache) {
      this->Makefile->AddCacheDefinition(this->VariableName, value,
                                         this->VariableDocumentation,
                                         this->VariableType, force);
      if (updateNormalVariable &&
          this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
        this->Makefile->AddDefinition(this->VariableName, value);
      }
    } else {
      this->Makefile->AddDefinition(this->VariableName, value);
    }

    return;
  }

  auto notFound = cmStrCat(this->VariableName, "-NOTFOUND");
  if (this->StoreResultInCache) {
    this->Makefile->AddCacheDefinition(this->VariableName, notFound,
                                       this->VariableDocumentation,
                                       this->VariableType, force);
    if (updateNormalVariable &&
        this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
      this->Makefile->AddDefinition(this->VariableName, notFound);
    }
  } else {
    this->Makefile->AddDefinition(this->VariableName, notFound);
  }

  if (this->Required) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Could not find ", this->VariableName, " using the following ",
               (this->FindCommandName == "find_file" ||
                    this->FindCommandName == "find_path"
                  ? "files"
                  : "names"),
               ": ", cmJoin(this->Names, ", ")));
    cmSystemTools::SetFatalErrorOccurred();
  }
}